

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O0

int libj1939_prepare_for_events(libj1939_cmn *cmn,int *nfds,_Bool dont_wait)

{
  uint __errnum;
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  byte in_DL;
  int *in_RSI;
  int *in_RDI;
  int timeout_ms;
  int ret;
  int local_24;
  undefined4 in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe4;
  uint local_4;
  
  if ((in_DL & 1) == 0) {
    local_24 = libj1939_get_timeout_ms
                         ((timespec *)
                          (CONCAT44(CONCAT13(in_DL,in_stack_ffffffffffffffe4),
                                    in_stack_ffffffffffffffe0) & 0x1ffffffffffffff));
  }
  else {
    local_24 = 0;
  }
  iVar1 = epoll_wait(*in_RDI,*(epoll_event **)(in_RDI + 2),(int)*(undefined8 *)(in_RDI + 4),local_24
                    );
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (-iVar1 != -4) {
      *in_RSI = 0;
      return -iVar1;
    }
    iVar1 = -4;
  }
  *in_RSI = iVar1;
  iVar1 = clock_gettime(1,(timespec *)(in_RDI + 10));
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    __stream = _stderr;
    __errnum = -*piVar2;
    local_4 = __errnum;
    pcVar3 = strerror(__errnum);
    fprintf(__stream,"failed to get time: %i (%s)",(ulong)__errnum,pcVar3);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int libj1939_prepare_for_events(struct libj1939_cmn *cmn, int *nfds,
				bool dont_wait)
{
	int ret, timeout_ms;

	if (dont_wait)
		timeout_ms = 0;
	else
		timeout_ms = libj1939_get_timeout_ms(&cmn->next_send_time);

	ret = epoll_wait(cmn->epoll_fd, cmn->epoll_events,
			 cmn->epoll_events_size, timeout_ms);
	if (ret < 0) {
		ret = -errno;
		if (ret != -EINTR) {
			*nfds = 0;
			return ret;
		}
	}

	*nfds = ret;

	ret = clock_gettime(CLOCK_MONOTONIC, &cmn->last_time);
	if (ret < 0) {
		ret = -errno;
		pr_err("failed to get time: %i (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}